

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

Long __thiscall amrex::Amr::cellCount(Amr *this)

{
  Long LVar1;
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  *in_RDI;
  int i;
  Long cnt;
  size_type in_stack_ffffffffffffffd8;
  int local_14;
  long local_10;
  
  local_10 = 0;
  for (local_14 = 0;
      local_14 <=
      *(int *)((long)&in_RDI[6].
                      super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 4); local_14 = local_14 + 1) {
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[](in_RDI,in_stack_ffffffffffffffd8);
    std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
              ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)0x10e3893);
    LVar1 = AmrLevel::countCells((AmrLevel *)0x10e389b);
    local_10 = LVar1 + local_10;
  }
  return local_10;
}

Assistant:

Long
Amr::cellCount () noexcept
{
    Long cnt = 0;
    for (int i = 0; i <= finest_level; i++) {
        cnt += amr_level[i]->countCells();
    }
    return cnt;
}